

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::updateFtranBFRT(HDual *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [12];
  undefined4 uVar3;
  undefined1 auVar4 [16];
  
  if (this->invertHint != 0) {
    return;
  }
  uVar1 = rdtsc();
  uVar3 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar2._4_4_ = uVar3;
  auVar2._0_4_ = uVar3;
  auVar2._8_4_ = 0;
  auVar4._0_12_ = auVar2 << 0x20;
  auVar4._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0x14] =
       (auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  HDualRow::update_flip(&this->dualRow,&this->columnBFRT);
  if ((this->columnBFRT).count != 0) {
    HFactor::ftran(this->factor,&this->columnBFRT,this->columnDensity);
  }
  HTimer::recordFinish(&this->model->timer,0x14);
  return;
}

Assistant:

void HDual::updateFtranBFRT() {
	if (invertHint)
		return;
	model->timer.recordStart(HTICK_FTRAN_MIX);
	dualRow.update_flip(&columnBFRT);
	if (columnBFRT.count)
		factor->ftran(columnBFRT, columnDensity);
	model->timer.recordFinish(HTICK_FTRAN_MIX);
}